

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uint32_t seekWaveToData(FILE *waveFile,WaveFmt *fmt)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte extraout_AL;
  byte bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  char *format;
  char waveHeader [13];
  
  waveHeader[8] = '\0';
  waveHeader[9] = '\0';
  waveHeader[10] = '\0';
  waveHeader[0xb] = '\0';
  waveHeader[0xc] = '\0';
  waveHeader[0] = '\0';
  waveHeader[1] = '\0';
  waveHeader[2] = '\0';
  waveHeader[3] = '\0';
  waveHeader[4] = '\0';
  waveHeader[5] = '\0';
  waveHeader[6] = '\0';
  waveHeader[7] = '\0';
  fread(waveHeader,0xc,1,(FILE *)waveFile);
  cVar4 = waveHeader[7];
  cVar3 = waveHeader[6];
  cVar2 = waveHeader[5];
  uVar8 = (ulong)(byte)waveHeader[4];
  waveHeader[4] = '\0';
  iVar6 = bcmp(waveHeader,"RIFF",5);
  if (iVar6 != 0) goto LAB_0010362e;
  iVar6 = bcmp(waveHeader + 8,"WAVE",5);
  if (iVar6 != 0) goto LAB_0010362e;
  do {
    lVar7 = ftell((FILE *)waveFile);
    if ((long)((ulong)(byte)cVar4 << 0x18 |
              (ulong)(byte)cVar3 << 0x10 | (ulong)(byte)cVar2 << 8 | uVar8 + 8) <= lVar7) {
      format = "data chunk not found!";
      goto LAB_00103608;
    }
    fread(waveHeader,8,1,(FILE *)waveFile);
    lVar7 = ftell((FILE *)waveFile);
    uVar1 = CONCAT13(waveHeader[7],CONCAT12(waveHeader[6],CONCAT11(waveHeader[5],waveHeader[4])));
    waveHeader[4] = '\0';
    iVar6 = bcmp(waveHeader,"fmt ",5);
    if (iVar6 == 0) {
      fread(fmt,0x10,1,(FILE *)waveFile);
      bVar5 = fmt->audio_format[1];
      if (fmt->audio_format[0] != '\x01') goto LAB_0010360f;
      if (bVar5 != 0) goto LAB_0010360f;
      if ((fmt->bits_per_sample[0] & 7) != 0) {
        do {
          die("only 8, 16, 24 bit audio supported (audio file is %d bits)");
LAB_0010362e:
          format = "not a valid wave file";
LAB_00103608:
          die(format);
          bVar5 = extraout_AL;
LAB_0010360f:
          die("only PCM audio is supported (audio format is 0x%2x%2x)",(ulong)bVar5);
        } while( true );
      }
    }
    else {
      iVar6 = bcmp(waveHeader,"data",5);
      if (iVar6 == 0) {
        printf("data chunk found at %ld\n",lVar7);
        return uVar1;
      }
    }
    fseek((FILE *)waveFile,lVar7 + (ulong)uVar1,0);
  } while( true );
}

Assistant:

uint32_t seekWaveToData(FILE* waveFile, struct WaveFmt *fmt){
	char waveHeader[13] = {0};
	uint32_t fileLength;
	long chunkStart;
	uint32_t chunkSize;

	fread(waveHeader, 12, 1, waveFile);
	fileLength = 8 + ((uint32_t)(uint8_t)waveHeader[4]) | 
		(((uint32_t)(uint8_t)waveHeader[5]) << 8) | 
		(((uint32_t)(uint8_t)waveHeader[6]) << 16) | 
		(((uint32_t)(uint8_t)waveHeader[7]) << 24);
	waveHeader[4] = 0;
	if(strcmp(&waveHeader[0], "RIFF") != 0 || strcmp(&waveHeader[8], "WAVE") != 0){
		die("not a valid wave file");
	}

	while(ftell(waveFile) < fileLength){
		fread(waveHeader, 8, 1, waveFile);
		chunkStart = ftell(waveFile);
		chunkSize = ((uint32_t)(uint8_t)waveHeader[4]) | 
			(((uint32_t)(uint8_t)waveHeader[5]) << 8) | 
			(((uint32_t)(uint8_t)waveHeader[6]) << 16) | 
			(((uint32_t)(uint8_t)waveHeader[7]) << 24);
		waveHeader[4] = 0;
		if(!strcmp(&waveHeader[0], "fmt ")){
			fread(fmt, 16, 1, waveFile);
			if(fmt->audio_format[0] != 1 || fmt->audio_format[1] != 0)
				die("only PCM audio is supported (audio format is 0x%2x%2x)", fmt->audio_format[1], fmt->audio_format[0]);
			if(fmt->bits_per_sample[0] % 8 != 0)
				die("only 8, 16, 24 bit audio supported (audio file is %d bits)", fmt->bits_per_sample[0]);
		}else if(!strcmp(&waveHeader[0], "data")){
			printf("data chunk found at %ld\n", chunkStart);
			return chunkSize;
		}
		fseek(waveFile, chunkStart + chunkSize, SEEK_SET);
	}

	die("data chunk not found!");
	return -1;
}